

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

void Fxu_PairClearStorage(Fxu_Cube *pCube)

{
  Fxu_Var *pFVar1;
  int local_1c;
  int i;
  Fxu_Var *pVar;
  Fxu_Cube *pCube_local;
  
  pFVar1 = pCube->pVar;
  for (local_1c = 0; local_1c < pFVar1->nCubes; local_1c = local_1c + 1) {
    pFVar1->ppPairs[pCube->iCube][local_1c] = (Fxu_Pair *)0x0;
    pFVar1->ppPairs[local_1c][pCube->iCube] = (Fxu_Pair *)0x0;
  }
  return;
}

Assistant:

void Fxu_PairClearStorage( Fxu_Cube * pCube )
{
    Fxu_Var * pVar;
    int i;
    pVar = pCube->pVar;
    for ( i = 0; i < pVar->nCubes; i++ )
    {
        pVar->ppPairs[pCube->iCube][i] = NULL;
        pVar->ppPairs[i][pCube->iCube] = NULL;
    }
}